

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::TasmanianSparseGrid::getDifferentiationWeights
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianSparseGrid *this
          ,vector<double,_std::allocator<double>_> *x)

{
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDifferentiationWeights(this,x,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> TasmanianSparseGrid::getDifferentiationWeights(std::vector<double> const &x) const{
    std::vector<double> w;
    getDifferentiationWeights(x, w);
    return w;
}